

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O0

string * __thiscall AlignmentRecord::getAlignSequence1_abi_cxx11_(AlignmentRecord *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x220));
  return in_RDI;
}

Assistant:

std::string AlignmentRecord::getAlignSequence1() const{
    return this->alignSequence1;
}